

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O2

SPIRAccessChain * __thiscall
spirv_cross::Compiler::
set<spirv_cross::SPIRAccessChain,unsigned_int_const&,spv::StorageClass_const&,std::__cxx11::string&,std::__cxx11::string&,unsigned_int&>
          (Compiler *this,uint32_t id,uint *args,StorageClass *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,uint *args_4)

{
  SPIRAccessChain *pSVar1;
  
  ParsedIR::add_typed_id(&this->ir,TypeAccessChain,(ID)id);
  pSVar1 = variant_set<spirv_cross::SPIRAccessChain,unsigned_int_const&,spv::StorageClass_const&,std::__cxx11::string&,std::__cxx11::string&,unsigned_int&>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id,args,args_1,
                      args_2,args_3,args_4);
  (pSVar1->super_IVariant).self.id = id;
  return pSVar1;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		set_initializers(var);
		return var;
	}